

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

qsizetype QtPrivate::lastIndexOf
                    (QLatin1StringView haystack,qsizetype from,QLatin1StringView needle,
                    CaseSensitivity cs)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  CaseSensitivity in_stack_0000007c;
  qsizetype in_stack_00000080;
  undefined1 in_stack_000000d0 [16];
  undefined1 in_stack_000000e0 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = (anonymous_namespace)::qLastIndexOf<QLatin1String,QLatin1String>
                    ((QLatin1String)in_stack_000000e0,in_stack_00000080,
                     (QLatin1String)in_stack_000000d0,in_stack_0000007c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QLatin1StringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}